

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O2

ostream * absl::operator<<(ostream *os,uint128 v)

{
  uint uVar1;
  ostream *poVar2;
  char cVar3;
  ulong uVar4;
  fmtflags in_R8D;
  size_t count;
  long lVar5;
  uint128 v_00;
  string rep;
  
  v_00.lo_ = v.hi_;
  uVar1 = *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  v_00.hi_._0_4_ = uVar1;
  v_00.hi_._4_4_ = 0;
  (anonymous_namespace)::Uint128ToFormattedString_abi_cxx11_(&rep,(void *)v.lo_,v_00,in_R8D);
  uVar4 = *(ulong *)(os + *(long *)(*(long *)os + -0x18) + 0x10);
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 0;
  lVar5 = uVar4 - rep._M_string_length;
  if (uVar4 < rep._M_string_length || lVar5 == 0) goto LAB_001504de;
  cVar3 = (char)lVar5;
  if (((byte)uVar1 & 0xb0) == 0x10) {
    if (((uVar1 & 0x24a) != 0x208) || ((void *)v.lo_ == (void *)0x0 && v_00.lo_ == 0))
    goto LAB_001504c0;
    std::ios::fill();
    uVar4 = 2;
  }
  else {
    if ((uVar1 & 0xb0) == 0x20) {
      std::ios::fill();
      std::__cxx11::string::append((ulong)&rep,cVar3);
      goto LAB_001504de;
    }
LAB_001504c0:
    std::ios::fill();
    uVar4 = 0;
  }
  std::__cxx11::string::insert((ulong)&rep,uVar4,cVar3);
LAB_001504de:
  poVar2 = std::operator<<(os,(string *)&rep);
  std::__cxx11::string::_M_dispose();
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& os, uint128 v) {
  std::ios_base::fmtflags flags = os.flags();
  std::string rep = Uint128ToFormattedString(v, flags);

  // Add the requisite padding.
  std::streamsize width = os.width(0);
  if (static_cast<size_t>(width) > rep.size()) {
    const size_t count = static_cast<size_t>(width) - rep.size();
    std::ios::fmtflags adjustfield = flags & std::ios::adjustfield;
    if (adjustfield == std::ios::left) {
      rep.append(count, os.fill());
    } else if (adjustfield == std::ios::internal &&
               (flags & std::ios::showbase) &&
               (flags & std::ios::basefield) == std::ios::hex && v != 0) {
      rep.insert(size_t{2}, count, os.fill());
    } else {
      rep.insert(size_t{0}, count, os.fill());
    }
  }

  return os << rep;
}